

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  undefined8 this_00;
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  anon_class_16_2_4cebe8fc *in_RDX;
  Exception *exception;
  ExceptionOrValue *local_350;
  Maybe<kj::Exception> local_348;
  undefined1 local_1b0 [8];
  NullableValue<kj::Exception> _exception2474;
  ExceptionOrValue *output_local;
  TransformPromiseNodeBase *this_local;
  
  exception = (Exception *)this;
  local_350 = output;
  _exception2474.field_1.value.details.builder.disposer = (ArrayDisposer *)output;
  runCatchingExceptions<kj::_::TransformPromiseNodeBase::get(kj::_::ExceptionOrValue&)::__0>
            (&local_348,(kj *)&exception,in_RDX);
  other = readMaybe<kj::Exception>(&local_348);
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1b0,other);
  Maybe<kj::Exception>::~Maybe(&local_348);
  pEVar1 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1b0);
  if (pEVar1 != (Exception *)0x0) {
    pEVar1 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1b0);
    this_00 = _exception2474.field_1.value.details.builder.disposer;
    pEVar1 = mv<kj::Exception>(pEVar1);
    ExceptionOrValue::addException((ExceptionOrValue *)this_00,pEVar1);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1b0);
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(exception));
  }
}